

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O2

cmValue __thiscall cmStateDirectory::GetProperty(cmStateDirectory *this,string *prop,bool chain)

{
  pointer pcVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  PointerType pBVar5;
  string *__x;
  cmValue cVar6;
  cmStateSnapshot *ci;
  pointer this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rng;
  string_view separator;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view separator_00;
  string_view separator_01;
  string_view separator_02;
  string_view separator_03;
  string_view separator_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  cmStateSnapshot parent;
  undefined1 local_70 [40];
  cmStateSnapshot snp;
  
  if ((GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_)
     , iVar4 != 0)) {
    GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_.field_2;
    GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_string_length = 0;
    GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_.field_2._M_local_buf[0] = '\0';
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
  }
  GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_string_length = 0;
  *GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p = '\0';
  bVar2 = std::operator==(prop,"PARENT_DIRECTORY");
  if (bVar2) {
    cmStateSnapshot::GetBuildsystemDirectoryParent(&parent,&this->Snapshot_);
    bVar2 = cmStateSnapshot::IsValid(&parent);
    if (bVar2) {
      cmStateSnapshot::GetDirectory((cmStateDirectory *)local_70,&parent);
      pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                         ((iterator *)local_70);
      return (cmValue)&pBVar5->Location;
    }
    return (cmValue)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_;
  }
  _Var3 = std::operator==(prop,&kBINARY_DIR_abi_cxx11_);
  if (_Var3) {
    cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
              (&this->DirectoryState);
LAB_00390637:
    std::__cxx11::string::_M_assign
              ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
    return (cmValue)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_;
  }
  _Var3 = std::operator==(prop,&kSOURCE_DIR_abi_cxx11_);
  if (_Var3) {
    cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
              (&this->DirectoryState);
    goto LAB_00390637;
  }
  _Var3 = std::operator==(prop,&kSUBDIRECTORIES_abi_cxx11_);
  if (_Var3) {
    parent._0_16_ = ZEXT816(0);
    parent.Position.Position = 0;
    pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&this->DirectoryState);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&parent,
              ((long)(pBVar5->Children).
                     super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(pBVar5->Children).
                    super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x18);
    pcVar1 = (pBVar5->Children).
             super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_00 = (pBVar5->Children).
                   super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
                   super__Vector_impl_data._M_start; this_00 != pcVar1; this_00 = this_00 + 1) {
      cmStateSnapshot::GetDirectory((cmStateDirectory *)local_70,this_00);
      pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                         ((iterator *)local_70);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&parent,&pBVar5->Location);
    }
    separator._M_str = ";";
    separator._M_len = 1;
    cmJoin((string *)local_70,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&parent,separator,(string_view)ZEXT816(0));
    goto LAB_00390726;
  }
  _Var3 = std::operator==(prop,&kBUILDSYSTEM_TARGETS_abi_cxx11_);
  if (_Var3) {
    pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&this->DirectoryState);
    rng = &pBVar5->NormalTargetNames;
  }
  else {
    __y._M_str = "IMPORTED_TARGETS";
    __y._M_len = 0x10;
    __x_00._M_str = (prop->_M_dataplus)._M_p;
    __x_00._M_len = prop->_M_string_length;
    bVar2 = std::operator==(__x_00,__y);
    if (!bVar2) {
      bVar2 = std::operator==(prop,"LISTFILE_STACK");
      if (bVar2) {
        parent.Position.Position = 0;
        parent._0_16_ = ZEXT816(0);
        snp.Position.Position = (this->Snapshot_).Position.Position;
        snp.State = (this->Snapshot_).State;
        snp.Position.Tree = (this->Snapshot_).Position.Tree;
        while (bVar2 = cmStateSnapshot::IsValid(&snp), bVar2) {
          __x = cmStateSnapshot::GetExecutionListFile_abi_cxx11_(&snp);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&parent,__x);
          cmStateSnapshot::GetCallStackParent((cmStateSnapshot *)local_70,&snp);
          snp.Position.Position = local_70._16_8_;
          snp.State = (cmState *)local_70._0_8_;
          snp.Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_70._8_8_;
        }
        std::
        __reverse<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (parent.State,parent.Position.Tree);
        separator_02._M_str = ";";
        separator_02._M_len = 1;
        cmJoin((string *)local_70,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&parent,separator_02,(string_view)ZEXT816(0));
LAB_00390726:
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                   (string *)local_70);
        std::__cxx11::string::~string((string *)local_70);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&parent);
        return (cmValue)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_;
      }
      bVar2 = std::operator==(prop,"CACHE_VARIABLES");
      if (bVar2) {
        cmState::GetCacheEntryKeys_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&parent,(this->Snapshot_).State);
        separator_01._M_str = ";";
        separator_01._M_len = 1;
        cmJoin((string *)local_70,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&parent,separator_01,(string_view)ZEXT816(0));
        goto LAB_00390726;
      }
      bVar2 = std::operator==(prop,"VARIABLES");
      if (bVar2) {
        cmStateSnapshot::ClosureKeys_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&parent,&this->Snapshot_);
        cmState::GetCacheEntryKeys_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_70,(this->Snapshot_).State);
        ::cm::
        append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&parent,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_70);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_70);
        std::
        __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (parent.State,parent.Position.Tree);
        separator_03._M_str = ";";
        separator_03._M_len = 1;
        cmJoin((string *)local_70,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&parent,separator_03,(string_view)ZEXT816(0));
        goto LAB_00390726;
      }
      bVar2 = std::operator==(prop,"INCLUDE_DIRECTORIES");
      if (bVar2) {
        parent._0_16_ = GetIncludeDirectoriesEntries_abi_cxx11_(this);
      }
      else {
        bVar2 = std::operator==(prop,"COMPILE_OPTIONS");
        if (bVar2) {
          parent._0_16_ = GetCompileOptionsEntries_abi_cxx11_(this);
        }
        else {
          bVar2 = std::operator==(prop,"COMPILE_DEFINITIONS");
          if (bVar2) {
            parent._0_16_ = GetCompileDefinitionsEntries_abi_cxx11_(this);
          }
          else {
            bVar2 = std::operator==(prop,"LINK_OPTIONS");
            if (bVar2) {
              parent._0_16_ = GetLinkOptionsEntries_abi_cxx11_(this);
            }
            else {
              bVar2 = std::operator==(prop,"LINK_DIRECTORIES");
              if (!bVar2) {
                pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::
                         operator->(&this->DirectoryState);
                cVar6 = cmPropertyMap::GetPropertyValue(&pBVar5->Properties,prop);
                if (!chain || cVar6.Value != (string *)0x0) {
                  return (cmValue)cVar6.Value;
                }
                cmStateSnapshot::GetBuildsystemDirectoryParent(&parent,&this->Snapshot_);
                bVar2 = cmStateSnapshot::IsValid(&parent);
                if (bVar2) {
                  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_70,&parent);
                  cVar6 = GetProperty((cmStateDirectory *)local_70,prop,true);
                  return (cmValue)cVar6.Value;
                }
                cVar6 = cmState::GetGlobalProperty((this->Snapshot_).State,prop);
                return (cmValue)cVar6.Value;
              }
              parent._0_16_ = GetLinkDirectoriesEntries_abi_cxx11_(this);
            }
          }
        }
      }
      separator_04._M_str = ";";
      separator_04._M_len = 1;
      cmJoin<cmRange<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>const*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>>
                ((string *)local_70,
                 (cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)&parent,separator_04);
      goto LAB_00390798;
    }
    pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&this->DirectoryState);
    rng = &pBVar5->ImportedTargetNames;
  }
  separator_00._M_str = ";";
  separator_00._M_len = 1;
  cmJoin((string *)local_70,rng,separator_00,(string_view)ZEXT816(0));
LAB_00390798:
  std::__cxx11::string::operator=
            ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
             (string *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  return (cmValue)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_;
}

Assistant:

cmValue cmStateDirectory::GetProperty(const std::string& prop,
                                      bool chain) const
{
  static std::string output;
  output.clear();
  if (prop == "PARENT_DIRECTORY") {
    cmStateSnapshot parent = this->Snapshot_.GetBuildsystemDirectoryParent();
    if (parent.IsValid()) {
      return cmValue(parent.GetDirectory().GetCurrentSource());
    }
    return cmValue(output);
  }
  if (prop == kBINARY_DIR) {
    output = this->GetCurrentBinary();
    return cmValue(output);
  }
  if (prop == kSOURCE_DIR) {
    output = this->GetCurrentSource();
    return cmValue(output);
  }
  if (prop == kSUBDIRECTORIES) {
    std::vector<std::string> child_dirs;
    std::vector<cmStateSnapshot> const& children =
      this->DirectoryState->Children;
    child_dirs.reserve(children.size());
    for (cmStateSnapshot const& ci : children) {
      child_dirs.push_back(ci.GetDirectory().GetCurrentSource());
    }
    output = cmJoin(child_dirs, ";");
    return cmValue(output);
  }
  if (prop == kBUILDSYSTEM_TARGETS) {
    output = cmJoin(this->DirectoryState->NormalTargetNames, ";");
    return cmValue(output);
  }
  if (prop == "IMPORTED_TARGETS"_s) {
    output = cmJoin(this->DirectoryState->ImportedTargetNames, ";");
    return cmValue(output);
  }

  if (prop == "LISTFILE_STACK") {
    std::vector<std::string> listFiles;
    cmStateSnapshot snp = this->Snapshot_;
    while (snp.IsValid()) {
      listFiles.push_back(snp.GetExecutionListFile());
      snp = snp.GetCallStackParent();
    }
    std::reverse(listFiles.begin(), listFiles.end());
    output = cmJoin(listFiles, ";");
    return cmValue(output);
  }
  if (prop == "CACHE_VARIABLES") {
    output = cmJoin(this->Snapshot_.State->GetCacheEntryKeys(), ";");
    return cmValue(output);
  }
  if (prop == "VARIABLES") {
    std::vector<std::string> res = this->Snapshot_.ClosureKeys();
    cm::append(res, this->Snapshot_.State->GetCacheEntryKeys());
    std::sort(res.begin(), res.end());
    output = cmJoin(res, ";");
    return cmValue(output);
  }
  if (prop == "INCLUDE_DIRECTORIES") {
    output = cmJoin(this->GetIncludeDirectoriesEntries(), ";");
    return cmValue(output);
  }
  if (prop == "COMPILE_OPTIONS") {
    output = cmJoin(this->GetCompileOptionsEntries(), ";");
    return cmValue(output);
  }
  if (prop == "COMPILE_DEFINITIONS") {
    output = cmJoin(this->GetCompileDefinitionsEntries(), ";");
    return cmValue(output);
  }
  if (prop == "LINK_OPTIONS") {
    output = cmJoin(this->GetLinkOptionsEntries(), ";");
    return cmValue(output);
  }
  if (prop == "LINK_DIRECTORIES") {
    output = cmJoin(this->GetLinkDirectoriesEntries(), ";");
    return cmValue(output);
  }

  cmValue retVal = this->DirectoryState->Properties.GetPropertyValue(prop);
  if (!retVal && chain) {
    cmStateSnapshot parentSnapshot =
      this->Snapshot_.GetBuildsystemDirectoryParent();
    if (parentSnapshot.IsValid()) {
      return parentSnapshot.GetDirectory().GetProperty(prop, chain);
    }
    return this->Snapshot_.State->GetGlobalProperty(prop);
  }

  return retVal;
}